

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  undefined1 uVar5;
  
  pbVar4 = (byte *)(ptr + ((long)end - (long)ptr & 0xfffffffffffffffe));
  if (((long)end - (long)ptr & 1U) == 0) {
    pbVar4 = (byte *)end;
  }
  if (pbVar4 != (byte *)ptr) {
    iVar2 = 0;
    do {
      bVar1 = *ptr;
      if (bVar1 < 0xdc) {
        uVar5 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar5 = *(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
          }
          else {
LAB_0015e74d:
            uVar5 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar5 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_0015e74d;
        uVar5 = 0;
      }
      switch(uVar5) {
      case 0:
      case 1:
      case 8:
        iVar2 = 0;
LAB_0015e826:
        *nextTokPtr = ptr;
        return iVar2;
      case 2:
        pbVar3 = (byte *)ptr + 2;
        if (pbVar3 == pbVar4) {
          return -1;
        }
        if ((*pbVar3 == 0) && (((byte *)ptr)[3] == 0x21)) {
          pbVar3 = (byte *)ptr + 4;
          if (pbVar3 == pbVar4) {
            return -1;
          }
          if ((*pbVar3 == 0) && (((byte *)ptr)[5] == 0x5b)) {
            iVar2 = iVar2 + 1;
            pbVar3 = (byte *)ptr + 6;
          }
        }
        break;
      case 4:
        pbVar3 = (byte *)ptr + 2;
        if (pbVar3 == pbVar4) {
          return -1;
        }
        if ((*pbVar3 == 0) && (((byte *)ptr)[3] == 0x5d)) {
          pbVar3 = (byte *)ptr + 4;
          if (pbVar3 == pbVar4) {
            return -1;
          }
          if ((*pbVar3 == 0) && (((byte *)ptr)[5] == 0x3e)) {
            ptr = (char *)((byte *)ptr + 6);
            if (iVar2 == 0) {
              iVar2 = 0x2a;
              goto LAB_0015e826;
            }
            iVar2 = iVar2 + -1;
            pbVar3 = (byte *)ptr;
          }
        }
        break;
      case 5:
        if ((long)pbVar4 - (long)ptr < 2) {
          return -2;
        }
      default:
        pbVar3 = (byte *)ptr + 2;
        break;
      case 6:
        if ((long)pbVar4 - (long)ptr < 3) {
          return -2;
        }
        pbVar3 = (byte *)ptr + 3;
        break;
      case 7:
        if ((long)pbVar4 - (long)ptr < 4) {
          return -2;
        }
        pbVar3 = (byte *)ptr + 4;
      }
      ptr = (char *)pbVar3;
    } while (pbVar3 != pbVar4);
  }
  return -1;
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}